

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O2

void __thiscall miniros::Publisher::Impl::unadvertise(Impl *this)

{
  TopicManagerPtr tm;
  _Alloc_hider local_20;
  
  if (this->unadvertised_ == false) {
    this->unadvertised_ = true;
    NodeHandle::getTopicManager((NodeHandle *)&stack0xffffffffffffffe0);
    if ((TopicManager *)local_20._M_p != (TopicManager *)0x0) {
      TopicManager::unadvertise((TopicManager *)local_20._M_p,&this->topic_,&this->callbacks_);
    }
    std::__shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->node_handle_).
                super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

void Publisher::Impl::unadvertise()
{
  if (!unadvertised_)
  {
    unadvertised_ = true;
    TopicManagerPtr tm = node_handle_->getTopicManager();
    if (tm)
      tm->unadvertise(topic_, callbacks_);
    node_handle_.reset();
  }
}